

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

int __thiscall
kratos::IfStmt::clone(IfStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  shared_ptr<kratos::IfStmt> sVar2;
  undefined1 local_60 [8];
  shared_ptr<kratos::Stmt> then_clone;
  shared_ptr<kratos::Stmt> else_clone;
  shared_ptr<kratos::IfStmt> if_;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  sVar2 = std::make_shared<kratos::IfStmt,std::shared_ptr<kratos::Var>const&>
                    ((shared_ptr<kratos::Var> *)
                     &else_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  (**(code **)(**(long **)(__fn + 0xe0) + 0x58))
            (local_60,*(long **)(__fn + 0xe0),
             sVar2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  (**(code **)(**(long **)(__fn + 0xf0) + 0x58))
            (&then_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Stmt::as<kratos::ScopedStmtBlock>
            ((Stmt *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
             (else_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi + 0xe),
             (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  (**(code **)(*else_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi[0xe]._vptr__Sp_counted_base + 0x38))();
  Stmt::as<kratos::ScopedStmtBlock>
            ((Stmt *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
             (else_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi + 0xf),
             (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  (**(code **)(*else_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi[0xf]._vptr__Sp_counted_base + 0x38))();
  this_00 = &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
             &else_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Stmt::copy_meta((Stmt *)__fn,(shared_ptr<kratos::Stmt> *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  peVar1 = if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_Stmt).super_IRNode._vptr_IRNode =
       (_func_int **)
       else_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar1;
  else_clone.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&else_clone);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&then_clone);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> IfStmt::clone() const {
    auto if_ = std::make_shared<IfStmt>(predicate_);
    auto then_clone = then_body_->clone();
    auto else_clone = else_body_->clone();

    if_->then_body_ = then_clone->as<ScopedStmtBlock>();
    if_->then_body_->set_parent(if_.get());
    if_->else_body_ = else_clone->as<ScopedStmtBlock>();
    if_->else_body_->set_parent(if_.get());

    copy_meta(if_);

    return if_;
}